

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O0

MPP_RET mpp_packet_append(MppPacket dst,MppPacket src)

{
  MPP_RET MVar1;
  uint local_40;
  int local_3c;
  RK_U32 i;
  RK_U32 offset;
  MppPktSeg *segs;
  MppPacketImpl *src_impl;
  MppPacketImpl *dst_impl;
  MppPacket src_local;
  MppPacket dst_local;
  
  MVar1 = check_is_mpp_packet_f(dst,"mpp_packet_append");
  if ((MVar1 == MPP_OK) && (MVar1 = check_is_mpp_packet_f(src,"mpp_packet_append"), MVar1 == MPP_OK)
     ) {
    memcpy((void *)(*(long *)((long)dst + 0x10) + *(long *)((long)dst + 0x20)),
           *(void **)((long)src + 0x10),*(size_t *)((long)src + 0x20));
    if (*(int *)((long)src + 0x58) != 0) {
      _i = *(long *)((long)src + 0x128);
      local_3c = (int)*(undefined8 *)((long)dst + 0x20);
      for (local_40 = 0; local_40 < *(uint *)((long)src + 0x58); local_40 = local_40 + 1) {
        mpp_packet_add_segment_info(dst,*(RK_S32 *)(_i + 4),local_3c,*(RK_S32 *)(_i + 0xc));
        local_3c = *(int *)(_i + 0xc) + local_3c;
        _i = _i + 0x18;
      }
    }
    *(long *)((long)dst + 0x20) = *(long *)((long)src + 0x20) + *(long *)((long)dst + 0x20);
    dst_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(2,"mpp_packet","invalid input: dst %p src %p\n","mpp_packet_append",dst,src);
    dst_local._4_4_ = MPP_ERR_UNKNOW;
  }
  return dst_local._4_4_;
}

Assistant:

MPP_RET mpp_packet_append(MppPacket dst, MppPacket src)
{
    if (check_is_mpp_packet(dst) || check_is_mpp_packet(src)) {
        mpp_err_f("invalid input: dst %p src %p\n", dst, src);
        return MPP_ERR_UNKNOW;
    }

    MppPacketImpl *dst_impl = (MppPacketImpl *)dst;
    MppPacketImpl *src_impl = (MppPacketImpl *)src;

    memcpy((RK_U8 *)dst_impl->pos + dst_impl->length, src_impl->pos,
           src_impl->length);

    if (src_impl->segment_nb) {
        MppPktSeg *segs = src_impl->segments;
        RK_U32 offset = dst_impl->length;
        RK_U32 i;

        for (i = 0; i < src_impl->segment_nb; i++, segs++) {
            mpp_packet_add_segment_info(dst, segs->type, offset, segs->len);
            offset += segs->len;
        }
    }

    dst_impl->length += src_impl->length;
    return MPP_OK;
}